

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasindex.cpp
# Opt level: O3

void __thiscall LASindex::print(LASindex *this)

{
  BOOL BVar1;
  LASinterval *pLVar2;
  uint uVar3;
  uint uVar4;
  U32 UVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  
  LASinterval::get_cells(this->interval);
  BVar1 = LASinterval::has_cells(this->interval);
  if (BVar1) {
    uVar8 = 0;
    uVar4 = 0;
    uVar3 = 0;
    uVar6 = 0;
    do {
      BVar1 = LASinterval::has_intervals(this->interval);
      UVar5 = 0;
      uVar7 = 0;
      if (BVar1) {
        uVar7 = 0;
        UVar5 = 0;
        do {
          pLVar2 = this->interval;
          UVar5 = ((UVar5 + pLVar2->end) - pLVar2->start) + 1;
          uVar7 = uVar7 + 1;
          BVar1 = LASinterval::has_intervals(pLVar2);
        } while (BVar1);
      }
      pLVar2 = this->interval;
      if (UVar5 != pLVar2->total) {
        LASMessage(LAS_VERBOSE,"total_check %d != interval->total %d",(ulong)UVar5);
        pLVar2 = this->interval;
        UVar5 = pLVar2->total;
      }
      LASMessage(LAS_VERY_VERBOSE,"cell %d intervals %d full %d total %d (%.2f)",
                 (double)(((float)pLVar2->full * 100.0) / (float)UVar5),(ulong)(uint)pLVar2->index,
                 (ulong)uVar7,(ulong)pLVar2->full,(ulong)UVar5);
      pLVar2 = this->interval;
      uVar3 = uVar3 + pLVar2->full;
      uVar6 = uVar6 + 1;
      uVar4 = uVar4 + pLVar2->total;
      uVar8 = uVar8 + uVar7;
      BVar1 = LASinterval::has_cells(pLVar2);
    } while (BVar1);
    fVar9 = (float)uVar4;
  }
  else {
    fVar9 = 0.0;
    uVar6 = 0;
    uVar3 = 0;
    uVar8 = 0;
  }
  LASMessage(LAS_VERY_VERBOSE,"total cells/intervals %d/%d full %d (%.2f)",
             (double)(((float)uVar3 * 100.0) / fVar9),(ulong)uVar6,(ulong)uVar8,(ulong)uVar3);
  return;
}

Assistant:

void LASindex::print()
{
  U32 total_cells = 0;
  U32 total_full = 0;
  U32 total_total = 0;
  U32 total_intervals = 0;
  U32 total_check;
  U32 intervals;
  interval->get_cells();
  while (interval->has_cells())
  {
    total_check = 0;
    intervals = 0;
    while (interval->has_intervals())
    {
      total_check += interval->end-interval->start+1;
      intervals++;
    }
    if (total_check != interval->total)
    {
      LASMessage(LAS_VERBOSE, "total_check %d != interval->total %d", total_check, interval->total);
    }
    LASMessage(LAS_VERY_VERBOSE, "cell %d intervals %d full %d total %d (%.2f)", interval->index, intervals, interval->full, interval->total, 100.0f*interval->full/interval->total);
    total_cells++;
    total_full += interval->full;
    total_total += interval->total;
    total_intervals += intervals;
  }
  LASMessage(LAS_VERY_VERBOSE, "total cells/intervals %d/%d full %d (%.2f)", total_cells, total_intervals, total_full, 100.0f*total_full/total_total);
}